

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O0

void __thiscall
BmsBuffer::GetObjectExistBar(BmsBuffer *this,set<int,_std::less<int>,_std::allocator<int>_> *barmap)

{
  ConstIterator this_00;
  bool bVar1;
  pointer __x;
  _Self local_28;
  _Self local_20;
  ConstIterator it;
  set<int,_std::less<int>,_std::allocator<int>_> *barmap_local;
  BmsBuffer *this_local;
  
  it._M_node = (_Base_ptr)barmap;
  local_20._M_node = (_Base_ptr)Begin(this);
  while( true ) {
    local_28._M_node = (_Base_ptr)End(this);
    bVar1 = std::operator!=(&local_20,&local_28);
    this_00 = it;
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_>::operator->(&local_20);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00._M_node,&__x->first);
    std::_Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_>::operator++(&local_20);
  }
  return;
}

Assistant:

void
BmsBuffer::GetObjectExistBar(std::set<barindex> &barmap) const
{
	for (auto it = Begin(); it != End(); ++it) {
		barmap.insert(it->first);
	}
}